

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjuliancalendar.cpp
# Opt level: O3

bool __thiscall
QJulianCalendar::dateToJulianDay(QJulianCalendar *this,int year,int month,int day,qint64 *jd)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (*(this->super_QRomanCalendar).super_QCalendarBackend._vptr_QCalendarBackend[6])();
  if (SUB41(iVar1,0) != false) {
    iVar2 = month + 9;
    if (2 < month) {
      iVar2 = month + -3;
    }
    *jd = (ulong)(iVar2 * 0x99 + 2) / 5 +
          (long)day + ((long)(int)((year - (year >> 0x1f)) - (uint)(month < 3)) * 0x5b5 >> 2) +
          0x1a431d;
  }
  return SUB41(iVar1,0);
}

Assistant:

bool QJulianCalendar::dateToJulianDay(int year, int month, int day, qint64 *jd) const
{
    Q_ASSERT(jd);
    if (!isDateValid(year, month, day))
        return false;

    const auto yearDays = yearMonthToYearDays(year, month);
    *jd = qDiv<4>(FourYears * yearDays.year) + yearDays.days + day + JulianBaseJd;
    return true;
}